

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_26::RustCodeGenerator::GenerateRootFile
          (RustCodeGenerator *this,Parser *parser,string *path)

{
  bool bVar1;
  string *path_local;
  Parser *parser_local;
  RustCodeGenerator *this_local;
  
  bVar1 = GenerateRustModuleRootFile(parser,path);
  this_local._4_4_ = (Status)!bVar1;
  return this_local._4_4_;
}

Assistant:

Status GenerateRootFile(const Parser &parser,
                          const std::string &path) override {
    if (!GenerateRustModuleRootFile(parser, path)) { return Status::ERROR; }
    return Status::OK;
  }